

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::BinaryLambdaWrapper,bool,duckdb::timestamp_t(*)(duckdb::timestamp_t,duckdb::timestamp_t),false,true>
               (timestamp_t *ldata,timestamp_t *rdata,timestamp_t *result_data,idx_t count,
               ValidityMask *mask,_func_timestamp_t_timestamp_t_timestamp_t *fun)

{
  bool bVar1;
  timestamp_t tVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  int64_t *in_RSI;
  void *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  timestamp_t rentry_2;
  timestamp_t lentry_2;
  idx_t i;
  timestamp_t rentry_1;
  timestamp_t lentry_1;
  idx_t start;
  timestamp_t rentry;
  timestamp_t lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  idx_t in_stack_ffffffffffffff20;
  timestamp_t in_stack_ffffffffffffff28;
  ValidityMask *in_stack_ffffffffffffff30;
  _func_timestamp_t_timestamp_t_timestamp_t *in_stack_ffffffffffffff38;
  timestamp_t in_stack_ffffffffffffff40;
  timestamp_t in_stack_ffffffffffffff48;
  idx_t local_90;
  unsigned_long local_88;
  int64_t local_80;
  undefined8 local_78;
  int64_t local_70;
  int64_t local_68;
  undefined8 local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  int64_t *local_10;
  void *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RDI,(void *)((long)in_RDI + in_RCX * 8),in_RDX,(void *)((long)in_RDX + in_RCX * 8),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x4d);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (tVar2.value = 0; (ulong)tVar2.value < local_20; tVar2.value = tVar2.value + 1) {
      in_stack_ffffffffffffff28 =
           BinaryLambdaWrapper::
           Operation<duckdb::timestamp_t(*)(duckdb::timestamp_t,duckdb::timestamp_t),bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                     (*(_func_timestamp_t_timestamp_t_timestamp_t **)
                       ((long)local_8 + tVar2.value * 8),in_stack_ffffffffffffff48,tVar2,
                      (ValidityMask *)*local_10,in_stack_ffffffffffffff28.value);
      *(int64_t *)((long)local_18 + tVar2.value * 8) = in_stack_ffffffffffffff28.value;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0x5038e5);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff28.value,
                            in_stack_ffffffffffffff20);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_78 = *(undefined8 *)((long)local_8 + local_38 * 8);
          local_80 = *local_10;
          local_68 = local_80;
          local_60 = local_78;
          local_70 = (int64_t)BinaryLambdaWrapper::
                              Operation<duckdb::timestamp_t(*)(duckdb::timestamp_t,duckdb::timestamp_t),bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                                        (in_stack_ffffffffffffff38,in_stack_ffffffffffffff48,
                                         in_stack_ffffffffffffff40,in_stack_ffffffffffffff30,
                                         in_stack_ffffffffffffff28.value);
          *(int64_t *)((long)local_18 + local_38 * 8) = local_70;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_88 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_90 = local_38 - local_88;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_90);
            if (bVar1) {
              in_stack_ffffffffffffff48.value = *local_10;
              tVar2 = BinaryLambdaWrapper::
                      Operation<duckdb::timestamp_t(*)(duckdb::timestamp_t,duckdb::timestamp_t),bool,duckdb::timestamp_t,duckdb::timestamp_t,duckdb::timestamp_t>
                                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff48,
                                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff30,
                                 in_stack_ffffffffffffff28.value);
              *(int64_t *)((long)local_18 + local_38 * 8) = tVar2.value;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}